

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O1

void set_get_test(void)

{
  ulong uVar1;
  uint64_t *puVar2;
  int iVar3;
  bitset_container_t *bitset;
  ulong uVar4;
  ulong uVar5;
  size_t x;
  ulong uVar6;
  unsigned_long b;
  
  bitset = bitset_container_create();
  _assert_true((unsigned_long)bitset,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x46);
  uVar6 = 0;
  do {
    _assert_true((ulong)((bitset->words[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0),
                 "bitset_container_get(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x49);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x10000);
  uVar6 = 0xfffffffffffffffd;
  b = 1;
  do {
    uVar6 = uVar6 + 3;
    _assert_int_equal((long)bitset->cardinality,b - 1,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                      ,0x4d);
    uVar4 = uVar6 >> 6;
    _assert_true((ulong)((bitset->words[uVar4] >> (uVar6 & 0x3f) & 1) == 0),
                 "bitset_container_get(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x4f);
    uVar1 = bitset->words[uVar4];
    uVar5 = uVar1 | 1L << (uVar6 & 0x3f);
    bitset->cardinality = bitset->cardinality + (int)((uVar1 ^ uVar5) >> ((byte)uVar6 & 0x3f));
    bitset->words[uVar4] = uVar5;
    _assert_true(1,"bitset_container_get(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x51);
    _assert_int_equal((long)bitset->cardinality,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                      ,0x53);
    b = b + 1;
  } while (uVar6 < 0xfffd);
  uVar6 = 0;
  do {
    _assert_int_equal((ulong)((bitset->words[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0),
                      (ulong)((uVar6 / 3) * 3 == uVar6),
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                      ,0x57);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x10000);
  _assert_int_equal((long)bitset->cardinality,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x5a);
  iVar3 = bitset_container_compute_cardinality(bitset);
  _assert_int_equal((long)iVar3,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x5c);
  puVar2 = bitset->words;
  iVar3 = bitset->cardinality;
  uVar6 = 0xfffffffffffffffd;
  do {
    uVar6 = uVar6 + 3;
    uVar1 = puVar2[uVar6 >> 6];
    iVar3 = iVar3 - (uint)((uVar1 >> (uVar6 & 0x3f) & 1) != 0);
    puVar2[uVar6 >> 6] = uVar1 & ~(1L << (uVar6 & 0x3f));
  } while (uVar6 < 0xfffd);
  bitset->cardinality = iVar3;
  _assert_int_equal((long)iVar3,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x62);
  iVar3 = bitset_container_compute_cardinality(bitset);
  _assert_int_equal((long)iVar3,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,99);
  bitset_container_free(bitset);
  return;
}

Assistant:

DEFINE_TEST(set_get_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_false(bitset_container_get(B, x));
    }

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_int_equal(bitset_container_cardinality(B), x / 3);

        assert_false(bitset_container_get(B, x));
        bitset_container_set(B, x);
        assert_true(bitset_container_get(B, x));

        assert_int_equal(bitset_container_cardinality(B), x / 3 + 1);
    }

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(bitset_container_get(B, x), (x / 3 * 3 == x));
    }

    assert_int_equal(bitset_container_cardinality(B), (1 << 16) / 3 + 1);
    assert_int_equal(bitset_container_compute_cardinality(B),
                     (1 << 16) / 3 + 1);

    for (size_t x = 0; x < 1 << 16; x += 3) {
        bitset_container_remove(B, x);
    }

    assert_int_equal(bitset_container_cardinality(B), 0);
    assert_int_equal(bitset_container_compute_cardinality(B), 0);

    bitset_container_free(B);
}